

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O3

void CompiledMixedType<int,long>(void)

{
  int32_t a;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  int32_t tmp;
  int64_t u1;
  int ret_5;
  int32_t local_44;
  ulong local_40;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_38;
  int local_34;
  
  local_40 = 0;
  local_44 = 0;
  LargeIntRegMultiply<int,_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (0,(int64_t *)&local_40,&local_44);
  local_40 = 0;
  local_44 = 0;
  LargeIntRegMultiply<int,_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (0,(int64_t *)&local_40,&local_44);
  local_40 = 0;
  local_44 = 0;
  LargeIntRegMultiply<int,_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (0,(int64_t *)&local_40,&local_44);
  a = local_44;
  local_40 = 0;
  local_44 = 0;
  LargeIntRegMultiply<int,_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (a,(int64_t *)&local_40,&local_44);
  local_38.m_int = 1;
  local_40 = 1;
  local_44 = 0;
  DivisionHelper<int,_long,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_38.m_int,(long *)&local_40,&local_44);
  local_40 = local_40 & 0xffffffff00000000;
  local_44 = 1;
  DivisionHelper<int,_int,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_38.m_int,&local_44,(int *)&local_40);
  operator/(1,local_38);
  local_40 = 1;
  DivisionHelper<int,_long,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_38.m_int,(long *)&local_40,&local_38.m_int);
  local_40 = 1;
  DivisionHelper<int,_long,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_38.m_int,(long *)&local_40,&local_38.m_int);
  local_40 = 1;
  local_44 = 0;
  AdditionHelper<int,_long,_11>::AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_38.m_int,(long *)&local_40,&local_44);
  if (0xfffffffeffffffff < (long)local_38.m_int - 0x7fffffffU) {
    local_40 = 1;
    local_44 = 0;
    local_34 = local_38.m_int;
    AdditionHelper<int,_long,_11>::
    AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              (&local_34,(long *)&local_40,&local_44);
    local_40 = 1;
    AdditionHelper<int,_long,_11>::
    AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((int *)&local_38,(long *)&local_40,(int *)&local_38);
    local_40 = 1;
    AdditionHelper<int,_long,_11>::
    AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((int *)&local_38,(long *)&local_40,(int *)&local_38);
    local_38.m_int = 0;
    local_40 = 0;
    local_44 = 0;
    SubtractionHelper<int,_long,_8>::
    SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((int *)&local_38,(long *)&local_40,&local_44);
    local_44 = local_38.m_int;
    local_40 = 0;
    local_34 = 0;
    SubtractionHelper<long,_int,_17>::
    SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((long *)&local_40,&local_44,&local_34);
    local_40 = 0;
    SubtractionHelper<int,_long,_8>::
    SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((int *)&local_38,(long *)&local_40,(int *)&local_38);
    local_38.m_int = 1;
    local_40 = 1;
    SubtractionHelper<int,_long,_8>::
    SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((int *)&local_38,(long *)&local_40,(int *)&local_38);
    SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
              ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,1);
    SVar1 = SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                      ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       &local_38,
                       (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    operator<<(SVar1.m_int,(SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1)
    ;
    SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,1);
    SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,
               (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
              ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,1);
    SVar1 = SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                      ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       &local_38,
                       (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    operator>>(SVar1.m_int,(SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1)
    ;
    SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,1);
    SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_38,
               (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}